

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_cad_constrained(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  REF_BOOL *pRVar4;
  REF_CELL pRVar5;
  REF_GEOM ref_geom;
  REF_CELL pRVar6;
  REF_BOOL *pRVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  long lVar12;
  char *pcVar13;
  REF_STATUS RVar14;
  REF_CELL ref_cell;
  REF_BOOL edge2;
  REF_BOOL edge1;
  REF_BOOL edge0;
  REF_INT nodes [27];
  int local_cc;
  int local_c8;
  int local_c4;
  REF_BOOL *local_c0;
  REF_CELL local_b8;
  REF_GEOM local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  local_b0 = ref_grid->geom;
  *allowed = 1;
  RVar14 = 0;
  if (((-1 < node1) && (pRVar1 = ref_cell->ref_adj, node1 < pRVar1->nnode)) &&
     (lVar12 = (long)pRVar1->first[(uint)node1], lVar12 != -1)) {
    uVar8 = ref_cell_nodes(ref_cell,pRVar1->item[lVar12].ref,local_a8);
    pRVar6 = ref_cell;
    pRVar7 = allowed;
    pRVar4 = local_c0;
    pRVar5 = local_b8;
    ref_geom = local_b0;
    while (local_c0 = pRVar7, local_b8 = pRVar6, local_b0 = ref_geom, uVar8 == 0) {
      uVar9 = (ulong)ref_cell->node_per;
      if ((long)uVar9 < 1) {
LAB_001a522e:
        uVar8 = ref_geom_is_a(ref_geom,local_a8[0],1,&local_c4);
        if (uVar8 != 0) {
          uVar9 = (ulong)uVar8;
          pcVar13 = "e0";
          uVar11 = 0x309;
          goto LAB_001a51c0;
        }
        uVar8 = ref_geom_is_a(ref_geom,local_a8[1],1,&local_c8);
        if (uVar8 != 0) {
          uVar9 = (ulong)uVar8;
          pcVar13 = "e1";
          uVar11 = 0x30a;
          goto LAB_001a51c0;
        }
        uVar8 = ref_geom_is_a(ref_geom,local_a8[2],1,&local_cc);
        if (uVar8 != 0) {
          uVar9 = (ulong)uVar8;
          pcVar13 = "e2";
          uVar11 = 0x30b;
          goto LAB_001a51c0;
        }
        ref_cell = local_b8;
        if (((local_c4 != 0) && (local_c8 != 0)) && (local_cc != 0)) {
          *local_c0 = 0;
          return 0;
        }
      }
      else {
        uVar10 = 0;
        bVar3 = false;
        do {
          if (local_a8[uVar10] == node0) {
            bVar3 = true;
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        if (!bVar3) {
          if (0 < ref_cell->node_per) {
            uVar10 = 0;
            do {
              if (local_a8[uVar10] == node1) {
                local_a8[uVar10] = node0;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < uVar9);
          }
          goto LAB_001a522e;
        }
      }
      pRVar2 = ref_cell->ref_adj->item;
      lVar12 = (long)pRVar2[(int)lVar12].next;
      if (lVar12 == -1) {
        return 0;
      }
      uVar8 = ref_cell_nodes(ref_cell,pRVar2[lVar12].ref,local_a8);
      pRVar6 = local_b8;
      pRVar7 = local_c0;
      pRVar4 = local_c0;
      pRVar5 = local_b8;
      ref_geom = local_b0;
    }
    uVar9 = (ulong)uVar8;
    pcVar13 = "nodes";
    uVar11 = 0x300;
    local_c0 = pRVar4;
    local_b8 = pRVar5;
LAB_001a51c0:
    RVar14 = (REF_STATUS)uVar9;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar11,"ref_collapse_edge_cad_constrained",uVar9,pcVar13);
  }
  return RVar14;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_cad_constrained(REF_GRID ref_grid,
                                                     REF_INT node0,
                                                     REF_INT node1,
                                                     REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL will_be_collapsed;
  REF_BOOL edge0, edge1, edge2;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_geom_is_a(ref_geom, nodes[0], REF_GEOM_EDGE, &edge0), "e0");
    RSS(ref_geom_is_a(ref_geom, nodes[1], REF_GEOM_EDGE, &edge1), "e1");
    RSS(ref_geom_is_a(ref_geom, nodes[2], REF_GEOM_EDGE, &edge2), "e2");
    if (edge0 && edge1 && edge2) {
      *allowed = REF_FALSE;
      break;
    }
  }

  return REF_SUCCESS;
}